

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_magestaff.cpp
# Opt level: O0

int __thiscall AMageStaffFX2::SpecialMissileHit(AMageStaffFX2 *this,AActor *victim)

{
  uint uVar1;
  AActor *pAVar2;
  AActor *source;
  bool bVar3;
  TAngle<double> local_30;
  FName local_28;
  TFlags<ActorFlag2,_unsigned_int> local_24;
  AActor *local_20;
  AActor *victim_local;
  AMageStaffFX2 *this_local;
  
  local_20 = victim;
  victim_local = &this->super_AActor;
  pAVar2 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&(this->super_AActor).target);
  bVar3 = false;
  if ((victim != pAVar2) && (bVar3 = false, local_20->player == (player_t *)0x0)) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_24,(int)local_20 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
    uVar1 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_24);
    bVar3 = uVar1 == 0;
  }
  pAVar2 = local_20;
  if (bVar3) {
    source = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&(this->super_AActor).target);
    FName::FName(&local_28,NAME_Fire);
    TAngle<double>::TAngle(&local_30,0.0);
    P_DamageMobj(pAVar2,&this->super_AActor,source,10,&local_28,0,&local_30);
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int AMageStaffFX2::SpecialMissileHit (AActor *victim)
{
	if (victim != target &&
		!victim->player &&
		!(victim->flags2 & MF2_BOSS))
	{
		P_DamageMobj (victim, this, target, 10, NAME_Fire);
		return 1;	// Keep going
	}
	return -1;
}